

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O2

ExpressionValue *
expFuncRead<short>(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
                  vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters)

{
  bool bVar1;
  char cVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *source;
  short buffer;
  int64_t pos;
  StringLiteral *fileName;
  unsigned_long local_250;
  path fullName;
  ifstream file;
  
  bVar1 = getExpFuncParameter(parameters,0,&fileName,funcName,false);
  if (!bVar1) {
LAB_0012c693:
    (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
    (__return_storage_ptr__->strValue)._value._M_string_length = 0;
    (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->type = Invalid;
    (__return_storage_ptr__->field_1).intValue = 0;
    return __return_storage_ptr__;
  }
  pos = 0;
  bVar1 = getExpFuncParameter(parameters,1,&pos,funcName,true);
  if (!bVar1) goto LAB_0012c693;
  ghc::filesystem::u8path<std::__cxx11::string,ghc::filesystem::path>
            ((path *)&file,(filesystem *)fileName,source);
  getFullPathName(&fullName,(path *)&file);
  ghc::filesystem::path::~path((path *)&file);
  ghc::filesystem::basic_ifstream<char,_std::char_traits<char>_>::basic_ifstream
            (&file,&fullName,_S_in|_S_bin);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    Logger::queueError<StringLiteral>
              ((Logger *)0x1,0x1765bd,(char *)fileName,(StringLiteral *)funcName);
  }
  else {
    std::istream::seekg(&file,pos,0);
    if (((&file.super_basic_ifstream<char,_std::char_traits<char>_>.
           super_basic_istream<char,_std::char_traits<char>_>.field_0x20)
         [(long)file.super_basic_ifstream<char,_std::char_traits<char>_>.
                super_basic_istream<char,_std::char_traits<char>_>._vptr_basic_istream[-3]] & 7) ==
        0) {
      std::istream::read((char *)&file,(long)&buffer);
      bVar1 = ((&file.super_basic_ifstream<char,_std::char_traits<char>_>.
                 super_basic_istream<char,_std::char_traits<char>_>.field_0x20)
               [(long)file.super_basic_ifstream<char,_std::char_traits<char>_>.
                      super_basic_istream<char,_std::char_traits<char>_>._vptr_basic_istream[-3]] &
              5) == 0;
      if (bVar1) {
        lVar3 = (long)buffer;
      }
      else {
        local_250 = 2;
        Logger::queueError<unsigned_long,long,StringLiteral>
                  (Error,"Failed to read %d byte(s) from offset 0x%08X of %s",&local_250,&pos,
                   fileName);
        lVar3 = 0;
      }
      (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
      (__return_storage_ptr__->strValue)._value._M_string_length = 0;
      (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
      __return_storage_ptr__->type = (uint)bVar1;
      (__return_storage_ptr__->field_1).intValue = lVar3;
      goto LAB_0012c6d9;
    }
    Logger::queueError<long,StringLiteral>(Error,"Invalid offset 0x%08X of %s",&pos,fileName);
  }
  (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
  (__return_storage_ptr__->strValue)._value._M_string_length = 0;
  (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->type = Invalid;
  (__return_storage_ptr__->field_1).intValue = 0;
LAB_0012c6d9:
  ghc::filesystem::basic_ifstream<char,_std::char_traits<char>_>::~basic_ifstream(&file);
  ghc::filesystem::path::~path(&fullName);
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expFuncRead(const Identifier &funcName, const std::vector<ExpressionValue>& parameters)
{
	const StringLiteral* fileName;
	int64_t pos;

	GET_PARAM(parameters,0,fileName);
	GET_OPTIONAL_PARAM(parameters,1,pos,0);

	auto fullName = getFullPathName(fileName->path());

	fs::ifstream file(fullName, fs::ifstream::in | fs::ifstream::binary);
	if (!file.is_open())
	{
		Logger::queueError(Logger::Error, "Could not open %s",*fileName);
		return ExpressionValue();
	}

	file.seekg(pos);
	if (file.eof() || file.fail())
	{
		Logger::queueError(Logger::Error, "Invalid offset 0x%08X of %s", pos, *fileName);
		return ExpressionValue();
	}

	T buffer;
	file.read(reinterpret_cast<char*>(&buffer), sizeof(T));

	if (file.fail())
	{
		Logger::queueError(Logger::Error, "Failed to read %d byte(s) from offset 0x%08X of %s", sizeof(T), pos, *fileName);
		return ExpressionValue();
	}

	return ExpressionValue((int64_t) buffer);
}